

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O3

bool net_peer_eviction_tests::IsEvicted
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> candidates,
               unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               *node_ids,FastRandomContext *random_context)

{
  const_iterator cVar1;
  FastRandomContext *in_RDX;
  long in_FS_OFFSET;
  bool bVar2;
  optional<long> oVar3;
  _Storage<long,_true> local_28;
  undefined1 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  shuffle<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,FastRandomContext&>
            ((NodeEvictionCandidate *)(node_ids->_M_h)._M_buckets,
             (NodeEvictionCandidate *)(node_ids->_M_h)._M_bucket_count,in_RDX);
  oVar3 = SelectNodeToEvict((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *
                            )node_ids);
  local_28._M_value =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_20 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  if (((undefined1  [16])
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar2 = false;
  }
  else {
    cVar1 = std::
            _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)random_context,&local_28._M_value);
    bVar2 = cVar1.super__Node_iterator_base<long,_false>._M_cur != (__node_type *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsEvicted(std::vector<NodeEvictionCandidate> candidates, const std::unordered_set<NodeId>& node_ids, FastRandomContext& random_context)
{
    std::shuffle(candidates.begin(), candidates.end(), random_context);
    const std::optional<NodeId> evicted_node_id = SelectNodeToEvict(std::move(candidates));
    if (!evicted_node_id) {
        return false;
    }
    return node_ids.count(*evicted_node_id);
}